

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ffs_conv.c
# Opt level: O3

void ffs_internal_convert_field
               (FMFieldPtr src_spec,void *src,FMdata_type dest_type,int dest_size,void *dest)

{
  undefined1 uVar1;
  uint uVar2;
  undefined4 uVar3;
  unsigned_long_long uVar5;
  int iVar6;
  char *destc;
  void *__src;
  ulong uVar7;
  bool bVar8;
  longdouble in_ST0;
  longlong lVar4;
  
  if (dest_type == string_type) {
    return;
  }
  bVar8 = true;
  if (dest_type == float_type) {
    if (src_spec->byte_swap == '\0') {
      bVar8 = src_spec->src_float_format == src_spec->target_float_format;
    }
    else {
      bVar8 = ffs_reverse_float_formats[src_spec->src_float_format] ==
              (uint)src_spec->target_float_format;
    }
  }
  if ((src_spec->data_type == dest_type) && (!(bool)(bVar8 ^ 1U | src_spec->size != dest_size))) {
    __src = (void *)((long)src + src_spec->offset);
    if (src_spec->byte_swap == '\0') {
      if (__src == dest) {
        return;
      }
      memcpy(dest,__src,(long)dest_size);
      return;
    }
    uVar2 = dest_size >> 1;
    if (0 < (int)uVar2) {
      iVar6 = dest_size + -1;
      uVar7 = 0;
      do {
        uVar1 = *(undefined1 *)((long)__src + (long)iVar6);
        *(undefined1 *)((long)dest + (long)iVar6) = *(undefined1 *)((long)__src + uVar7);
        *(undefined1 *)((long)dest + uVar7) = uVar1;
        uVar7 = uVar7 + 1;
        iVar6 = iVar6 + -1;
      } while (uVar2 != uVar7);
    }
    if ((dest_size & 1U) == 0) {
      return;
    }
    *(undefined1 *)((long)dest + (long)(int)uVar2) = *(undefined1 *)((long)__src + (long)(int)uVar2)
    ;
    return;
  }
  switch((void *)(ulong)(dest_type - integer_type)) {
  case (void *)0x0:
    uVar5 = get_big_int(src_spec,src);
    switch(dest_size) {
    case 1:
switchD_00110c5f_caseD_1:
      uVar1 = (undefined1)uVar5;
      break;
    case 2:
switchD_00110c5f_caseD_2:
      *(short *)dest = (short)uVar5;
      return;
    default:
      goto switchD_00110bd5_caseD_4;
    case 4:
switchD_00110c5f_caseD_4:
      uVar3 = (undefined4)uVar5;
      goto LAB_00110bde;
    case 8:
switchD_00110c5f_caseD_8:
      *(unsigned_long_long *)dest = uVar5;
      goto switchD_00110bd5_caseD_4;
    }
LAB_00110c6c:
    *(undefined1 *)dest = uVar1;
    break;
  case (void *)0x1:
    uVar5 = get_big_unsigned(src_spec,src);
    switch(dest_size) {
    case 1:
      goto switchD_00110c5f_caseD_1;
    case 2:
      goto switchD_00110c5f_caseD_2;
    default:
      break;
    case 4:
      goto switchD_00110c5f_caseD_4;
    case 8:
      goto switchD_00110c5f_caseD_8;
    }
  case (void *)0x2:
    get_big_float((longdouble *)src_spec,(FMFieldPtr)src,(void *)(ulong)(dest_type - integer_type));
    if (dest_size == 0x10) {
      *(longdouble *)dest = in_ST0;
    }
    else if (dest_size == 8) {
      *(double *)dest = (double)in_ST0;
    }
    else if (dest_size == 4) {
      *(float *)dest = (float)in_ST0;
    }
    break;
  case (void *)0x3:
    lVar4 = get_big_int(src_spec,src);
    uVar1 = (undefined1)lVar4;
    goto LAB_00110c6c;
  case (void *)0x5:
  case (void *)0x6:
    lVar4 = get_big_int(src_spec,src);
    uVar3 = (undefined4)lVar4;
LAB_00110bde:
    *(undefined4 *)dest = uVar3;
  }
switchD_00110bd5_caseD_4:
  return;
}

Assistant:

extern void
ffs_internal_convert_field(FMFieldPtr src_spec, void *src, FMdata_type dest_type, int dest_size, void *dest)
{
    int float_OK = 1;
    if (dest_type == float_type) {
	FMfloat_format reverse_src = 
	    ffs_reverse_float_formats[src_spec->src_float_format];

	if (!src_spec->byte_swap && 
	    src_spec->src_float_format != src_spec->target_float_format) {
	    float_OK = 0;
	} else if (src_spec->byte_swap &&
		   reverse_src != src_spec->target_float_format) {
	    float_OK = 0;
	}
    }		   
    /* quick check to see if it's just a copy... */
    if ((dest_type != string_type) && (dest_type == src_spec->data_type) &&
	(dest_size == src_spec->size) && (float_OK == 1)) {
	if (src_spec->byte_swap) {
	    int i;
	    char *destc = (char *) dest;
	    char *srcc = (char *) src + src_spec->offset;
	    for (i = 0; i < (dest_size >> 1); i++) {
		char tmp = srcc[dest_size - i - 1];
		destc[dest_size - i - 1] = srcc[i];
		destc[i] = tmp;
	    }
	    if ((dest_size & 0x1) != 0) {
		destc[dest_size >> 1] = srcc[dest_size >> 1];
	    }
	} else {
	    char *srcc = (char *) src + src_spec->offset;
	    if (dest != srcc) memcpy(dest, srcc, dest_size);
	}
	return;
    }
    switch (dest_type) {
    case integer_type:
	{
	    MAX_INTEGER_TYPE tmp = get_big_int(src_spec, src);
	    if (dest_size == sizeof(char)) {
		char *dest_field = (char *) dest;
		*dest_field = (char) tmp;
	    } else if (dest_size == sizeof(short)) {
		short *dest_field = (short *) dest;
		*dest_field = (short) tmp;
	    } else if (dest_size == sizeof(int)) {
		int *dest_field = (int *) dest;
		*dest_field = (int) tmp;
	    } else if (dest_size == sizeof(long)) {
		long* dest_field = (long*)dest;
		*dest_field = (long)tmp;
	    } else if (dest_size == sizeof(size_t)) {
		size_t* dest_field = (size_t*)dest;
		*dest_field = (long)tmp;
#if SIZEOF_LONG_LONG != 0
	    } else if (dest_size == sizeof(long long)) {
		long long lltmp = tmp;
		memcpy(dest, &lltmp, sizeof(long long));
#endif
	    }
	    break;
	}
    case char_type:
	{
	    char tmp = (char)get_big_int(src_spec, src);
	    char *dest_field = (char *) dest;
	    *dest_field = tmp;
	    break;
	}
    case boolean_type:
    case enumeration_type:
	{
	    int tmp = (int) get_big_int(src_spec, src);
	    int *dest_field = (int *) dest;
	    *dest_field = tmp;
	    break;
	}
    case unsigned_type:
	{
	    MAX_UNSIGNED_TYPE tmp = get_big_unsigned(src_spec, src);
	    if (dest_size == sizeof(unsigned char)) {
		unsigned char *dest_field = (unsigned char *) dest;
		*dest_field = (unsigned char) tmp;
	    } else if (dest_size == sizeof(unsigned short)) {
		unsigned short *dest_field = (unsigned short *) dest;
		*dest_field = (unsigned short) tmp;
	    } else if (dest_size == sizeof(int)) {
		unsigned int* dest_field = (unsigned int*)dest;
		*dest_field = (unsigned int)tmp;
	    } else if (dest_size == sizeof(size_t)) {
		size_t* dest_field = (size_t*)dest;
		*dest_field = tmp;
#if SIZEOF_LONG_LONG != 0
	    } else if (dest_size == sizeof(long long)) {
		unsigned long long *dest_field = (unsigned long long *) dest;
		*dest_field = tmp;
#endif
	    }
	    break;
	}
    case float_type:
	{
	    MAX_FLOAT_TYPE tmp = get_big_float(src_spec, src);
	    if (dest_size == sizeof(float)) {
		float *dest_field = (float *) dest;
		*dest_field = (float) tmp;
	    } else if (dest_size == sizeof(double)) {
		double *dest_field = (double *) dest;
		*dest_field = tmp;
#if SIZEOF_LONG_DOUBLE != 0
	    } else if (dest_size == sizeof(long double)) {
		long double *dest_field = (long double *) dest;
		*dest_field = tmp;
#endif
	    }
	    break;
	}
    default:
	assert(FALSE);
    }
}